

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::prepare_root(Container *this)

{
  path *__lhs;
  path *this_00;
  pointer pcVar1;
  int iVar2;
  ContextManager *pCVar3;
  path local_b8;
  error_code error;
  path local_80;
  path proc_dir;
  
  iVar2 = mount("none","/","none",0x44000,(void *)0x0);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&proc_dir._M_pathname,"Cannot privatize mounts: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&proc_dir);
    std::__cxx11::string::~string((string *)&proc_dir);
  }
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  __lhs = &this->root_;
  std::filesystem::create_directories(__lhs,&error);
  if (error._M_value != 0) {
    pCVar3 = ContextManager::get();
    pcVar1 = (__lhs->_M_pathname)._M_dataplus._M_p;
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_b8,error._M_cat,error._M_value);
    format_abi_cxx11_(&proc_dir._M_pathname,"Cannot create root directory (%s): %s",pcVar1);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&proc_dir);
    std::__cxx11::string::~string((string *)&proc_dir);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  iVar2 = mount("none",(__lhs->_M_pathname)._M_dataplus._M_p,"tmpfs",0,"mode=755,size=1g");
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&proc_dir._M_pathname,"Cannot mount root tmpfs: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&proc_dir);
    std::__cxx11::string::~string((string *)&proc_dir);
  }
  iVar2 = mount("none",(__lhs->_M_pathname)._M_dataplus._M_p,"tmpfs",0x20,"mode=755,size=1g");
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&proc_dir._M_pathname,"Cannot remount root tmpfs: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&proc_dir);
    std::__cxx11::string::~string((string *)&proc_dir);
  }
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_b8,(char (*) [5])"proc",auto_format);
  std::filesystem::__cxx11::operator/(&proc_dir,__lhs,&local_b8);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::create_directories(&proc_dir,&error);
  if (error._M_value != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create \'/proc\' dir: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  iVar2 = mount("none",proc_dir._M_pathname._M_dataplus._M_p,"proc",0,"");
  if (iVar2 < 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot mount proc filesystem: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  iVar2 = mount("none",proc_dir._M_pathname._M_dataplus._M_p,"proc",0x20,"hidepid=2");
  if (iVar2 < 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot remount proc filesystem: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_80,(char (*) [5])"work",auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_80);
  this_00 = &this->work_dir_;
  std::filesystem::__cxx11::path::operator=(this_00,&local_b8);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::create_directories(this_00,&error);
  if (error._M_value != 0) {
    pCVar3 = ContextManager::get();
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_80,error._M_cat,error._M_value);
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create \'/work\' dir: %s",
                      local_80._M_pathname._M_dataplus._M_p);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_80,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_80);
  std::filesystem::create_directories(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_80);
  if (error._M_value != 0) {
    pCVar3 = ContextManager::get();
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_80,error._M_cat,error._M_value);
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create \'/tmp\' dir: %s",
                      local_80._M_pathname._M_dataplus._M_p);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_80,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_80);
  iVar2 = chmod(local_b8._M_pathname._M_dataplus._M_p,0x1ff);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_80);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot chmod() \'/tmp\': %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if (((this->task_data_).ptr_)->use_standard_binds == true) {
    Bind::apply_standard_rules(__lhs,this_00);
  }
  std::filesystem::__cxx11::path::~path(&proc_dir);
  return;
}

Assistant:

void Container::prepare_root() {
    if (mount("none", "/", "none", MS_REC | MS_PRIVATE, nullptr) != 0) {
        die(format("Cannot privatize mounts: %m"));
    }

    std::error_code error;
    fs::create_directories(root_, error);
    if (error) {
        die(format("Cannot create root directory (%s): %s", root_.c_str(), error.message().c_str()));
    }

    if (mount("none", root_.c_str(), "tmpfs", 0, "mode=755,size=1g") != 0) {
        die(format("Cannot mount root tmpfs: %m"));
    }
    if (mount("none", root_.c_str(), "tmpfs", MS_REMOUNT, "mode=755,size=1g") != 0) {
        die(format("Cannot remount root tmpfs: %m"));
    }

    fs::path proc_dir = root_ / "proc";
    fs::create_directories(proc_dir, error);
    if (error) {
        die(format("Cannot create '/proc' dir: %m"));
    }
    if (mount("none", proc_dir.c_str(), "proc", 0, "") < 0) {
        die(format("Cannot mount proc filesystem: %m"));
    }
    if (mount("none", proc_dir.c_str(), "proc", MS_REMOUNT, "hidepid=2") < 0) {
        die(format("Cannot remount proc filesystem: %m"));
    }

    work_dir_ = root_ / "work";
    fs::create_directories(work_dir_, error);
    if (error) {
        die(format("Cannot create '/work' dir: %s", error.message().c_str()));
    }

    fs::create_directories(root_ / "tmp");
    if (error) {
        die(format("Cannot create '/tmp' dir: %s", error.message().c_str()));
    }
    if (chmod((root_ / "tmp").c_str(), 0777) != 0) {
        die(format("Cannot chmod() '/tmp': %m"));
    }

    if (task_data_->use_standard_binds) {
        Bind::apply_standard_rules(root_, work_dir_);
    }
}